

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

bool __thiscall SimpleString::containsNoCase(SimpleString *this,SimpleString *other)

{
  byte bVar1;
  SimpleString *in_RDI;
  SimpleString *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  lowerCase(in_RDI);
  lowerCase(in_RDI);
  bVar1 = contains((SimpleString *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  ~SimpleString((SimpleString *)0x10defb);
  ~SimpleString((SimpleString *)0x10df05);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SimpleString::containsNoCase(const SimpleString& other) const
{
    return lowerCase().contains(other.lowerCase());
}